

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O1

S2Point * __thiscall
S2PaddedCell::GetEntryVertex(S2Point *__return_storage_ptr__,S2PaddedCell *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  S2Point local_28;
  
  iVar2 = this->ij_lo_[0];
  iVar1 = this->ij_lo_[1];
  if ((this->orientation_ & 2) != 0) {
    iVar3 = 1 << (0x1eU - (char)this->level_ & 0x1f);
    iVar2 = iVar2 + iVar3;
    iVar1 = iVar1 + iVar3;
  }
  S2::FaceSiTitoXYZ(&local_28,(uint)((this->id_).id_ >> 0x3d),iVar2 * 2,iVar1 * 2);
  dVar4 = local_28.c_[2] * local_28.c_[2] +
          local_28.c_[1] * local_28.c_[1] + local_28.c_[0] * local_28.c_[0];
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar4 = (double)(~-(ulong)(dVar4 != 0.0) & (ulong)dVar4 |
                  (ulong)(1.0 / dVar4) & -(ulong)(dVar4 != 0.0));
  __return_storage_ptr__->c_[0] = local_28.c_[0] * dVar4;
  __return_storage_ptr__->c_[1] = local_28.c_[1] * dVar4;
  __return_storage_ptr__->c_[2] = dVar4 * local_28.c_[2];
  return __return_storage_ptr__;
}

Assistant:

S2Point S2PaddedCell::GetEntryVertex() const {
  // The curve enters at the (0,0) vertex unless the axis directions are
  // reversed, in which case it enters at the (1,1) vertex.
  unsigned int i = ij_lo_[0];
  unsigned int j = ij_lo_[1];
  if (orientation_ & kInvertMask) {
    int ij_size = S2CellId::GetSizeIJ(level_);
    i += ij_size;
    j += ij_size;
  }
  return S2::FaceSiTitoXYZ(id_.face(), 2 * i, 2 * j).Normalize();
}